

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_parallel_csv.cpp
# Opt level: O3

bool RunVariableBuffer(string *path,idx_t buffer_size,bool set_temp_dir,
                      ColumnDataCollection *ground_truth,string *add_parameters)

{
  char *pcVar1;
  ulong uVar2;
  bool bVar3;
  ColumnDataCollection *pCVar4;
  char cVar5;
  char cVar6;
  long *plVar7;
  undefined8 *puVar8;
  ostream *poVar9;
  ColumnDataCollection *pCVar10;
  long *plVar11;
  ulong *puVar12;
  idx_t iVar13;
  char cVar14;
  ulong uVar15;
  string error_message;
  Connection multi_conn;
  DuckDB db;
  ulong *local_160;
  long local_158;
  ulong local_150;
  long lStack_148;
  _Head_base<0UL,_duckdb::MaterializedQueryResult_*,_false> local_140;
  char *local_138;
  long local_130;
  undefined8 local_128;
  undefined8 uStack_120;
  long *local_118;
  long *local_110;
  ulong *local_108;
  long local_100;
  ulong local_f8;
  long lStack_f0;
  ulong *local_e8;
  uint local_e0;
  undefined4 uStack_dc;
  ulong local_d8 [2];
  ColumnDataCollection *local_c8;
  long *local_c0;
  long local_b8;
  long local_b0;
  long lStack_a8;
  long *local_a0;
  long local_98;
  long local_90;
  long lStack_88;
  Connection local_80 [32];
  DuckDB local_60 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_c8 = ground_truth;
  duckdb::DuckDB::DuckDB(local_60,(char *)0x0,(DBConfig *)0x0);
  duckdb::Connection::Connection(local_80,local_60);
  if (set_temp_dir) {
    local_160 = &local_150;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_160,"PRAGMA temp_directory=\'offload.tmp\'","");
    duckdb::Connection::Query((string *)&local_110);
    if (local_110 != (long *)0x0) {
      (**(code **)(*local_110 + 8))();
    }
    local_110 = (long *)0x0;
    if (local_160 != &local_150) {
      operator_delete(local_160);
    }
  }
  local_160 = &local_150;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_160,"SET preserve_insertion_order=false;","");
  duckdb::Connection::Query((string *)&local_118);
  if (local_118 != (long *)0x0) {
    (**(code **)(*local_118 + 8))();
  }
  local_118 = (long *)0x0;
  if (local_160 != &local_150) {
    operator_delete(local_160);
  }
  std::operator+(&local_50,"SELECT * FROM read_csv_auto(\'",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)path);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_50);
  plVar11 = plVar7 + 2;
  if ((long *)*plVar7 == plVar11) {
    local_b0 = *plVar11;
    lStack_a8 = plVar7[3];
    local_c0 = &local_b0;
  }
  else {
    local_b0 = *plVar11;
    local_c0 = (long *)*plVar7;
  }
  local_b8 = plVar7[1];
  *plVar7 = (long)plVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_c0,(ulong)(add_parameters->_M_dataplus)._M_p);
  plVar11 = plVar7 + 2;
  if ((long *)*plVar7 == plVar11) {
    local_90 = *plVar11;
    lStack_88 = plVar7[3];
    local_a0 = &local_90;
  }
  else {
    local_90 = *plVar11;
    local_a0 = (long *)*plVar7;
  }
  local_98 = plVar7[1];
  *plVar7 = (long)plVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_a0);
  puVar12 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar12) {
    local_f8 = *puVar12;
    lStack_f0 = plVar7[3];
    local_108 = &local_f8;
  }
  else {
    local_f8 = *puVar12;
    local_108 = (ulong *)*plVar7;
  }
  local_100 = plVar7[1];
  *plVar7 = (long)puVar12;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  cVar6 = '\x01';
  if (9 < buffer_size) {
    iVar13 = buffer_size;
    cVar14 = '\x04';
    do {
      cVar6 = cVar14;
      if (iVar13 < 100) {
        cVar6 = cVar6 + -2;
        goto LAB_003f88c6;
      }
      if (iVar13 < 1000) {
        cVar6 = cVar6 + -1;
        goto LAB_003f88c6;
      }
      if (iVar13 < 10000) goto LAB_003f88c6;
      bVar3 = 99999 < iVar13;
      iVar13 = iVar13 / 10000;
      cVar14 = cVar6 + '\x04';
    } while (bVar3);
    cVar6 = cVar6 + '\x01';
  }
LAB_003f88c6:
  local_e8 = local_d8;
  std::__cxx11::string::_M_construct((ulong)&local_e8,cVar6);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_e8,local_e0,buffer_size);
  uVar2 = CONCAT44(uStack_dc,local_e0) + local_100;
  uVar15 = 0xf;
  if (local_108 != &local_f8) {
    uVar15 = local_f8;
  }
  if (uVar15 < uVar2) {
    uVar15 = 0xf;
    if (local_e8 != local_d8) {
      uVar15 = local_d8[0];
    }
    if (uVar15 < uVar2) goto LAB_003f8943;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_e8,0,(char *)0x0,(ulong)local_108);
  }
  else {
LAB_003f8943:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_108,(ulong)local_e8);
  }
  local_138 = (char *)&local_128;
  pcVar1 = (char *)(puVar8 + 2);
  if ((char *)*puVar8 == pcVar1) {
    local_128 = *(undefined8 *)pcVar1;
    uStack_120 = puVar8[3];
  }
  else {
    local_128 = *(undefined8 *)pcVar1;
    local_138 = (char *)*puVar8;
  }
  local_130 = puVar8[1];
  *puVar8 = pcVar1;
  puVar8[1] = 0;
  *pcVar1 = '\0';
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_138);
  local_160 = &local_150;
  puVar12 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar12) {
    local_150 = *puVar12;
    lStack_148 = plVar7[3];
  }
  else {
    local_150 = *puVar12;
    local_160 = (ulong *)*plVar7;
  }
  local_158 = plVar7[1];
  *plVar7 = (long)puVar12;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  duckdb::Connection::Query((string *)&local_140);
  if (local_160 != &local_150) {
    operator_delete(local_160);
  }
  if (local_138 != (char *)&local_128) {
    operator_delete(local_138);
  }
  if (local_e8 != local_d8) {
    operator_delete(local_e8);
  }
  pCVar4 = local_c8;
  if (local_108 != &local_f8) {
    operator_delete(local_108);
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0);
  }
  if (local_c0 != &local_b0) {
    operator_delete(local_c0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  duckdb::
  unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
  ::operator->((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                *)&local_140);
  cVar6 = duckdb::BaseQueryResult::HasError();
  if (cVar6 == '\0') {
    duckdb::
    unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
    ::operator->((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                  *)&local_140);
    pCVar10 = (ColumnDataCollection *)duckdb::MaterializedQueryResult::Collection();
    if (pCVar4 != (ColumnDataCollection *)0x0) {
      local_158 = 0;
      local_150 = local_150 & 0xffffffffffffff00;
      local_160 = &local_150;
      cVar6 = duckdb::ColumnDataCollection::ResultEquals(pCVar4,pCVar10,(string *)&local_160,false);
      if (cVar6 == '\0') {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"truth: ",7);
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
        std::ostream::put((char)poVar9);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"resul: ",7);
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
        std::ostream::put((char)poVar9);
        std::ostream::flush();
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(path->_M_dataplus)._M_p,path->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9," Buffer Size: ",0xe);
        cVar14 = '\x01';
        if (9 < buffer_size) {
          iVar13 = buffer_size;
          cVar5 = '\x04';
          do {
            cVar14 = cVar5;
            if (iVar13 < 100) {
              cVar14 = cVar14 + -2;
              goto LAB_003f8e06;
            }
            if (iVar13 < 1000) {
              cVar14 = cVar14 + -1;
              goto LAB_003f8e06;
            }
            if (iVar13 < 10000) goto LAB_003f8e06;
            bVar3 = 99999 < iVar13;
            iVar13 = iVar13 / 10000;
            cVar5 = cVar14 + '\x04';
          } while (bVar3);
          cVar14 = cVar14 + '\x01';
        }
LAB_003f8e06:
        local_138 = (char *)&local_128;
        std::__cxx11::string::_M_construct((ulong)&local_138,cVar14);
        std::__detail::__to_chars_10_impl<unsigned_long>(local_138,(uint)local_130,buffer_size);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,local_138,local_130);
        local_108 = (ulong *)CONCAT71(local_108._1_7_,10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)&local_108,1);
        if (local_138 != (char *)&local_128) {
          operator_delete(local_138);
        }
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)local_160,local_158);
        local_138 = (char *)CONCAT71(local_138._1_7_,10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)&local_138,1);
      }
      if (local_160 != &local_150) {
        operator_delete(local_160);
      }
      goto LAB_003f8ea7;
    }
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(path->_M_dataplus)._M_p,path->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9," Failed on max buffer but succeeded on variable buffer reading",0x3e);
    local_160 = (ulong *)CONCAT71(local_160._1_7_,10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)&local_160,1);
  }
  else {
    if (pCVar4 == (ColumnDataCollection *)0x0) {
      cVar6 = '\x01';
      goto LAB_003f8ea7;
    }
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(path->_M_dataplus)._M_p,path->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," Variable Buffer failed",0x17);
    local_160 = (ulong *)CONCAT71(local_160._1_7_,10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)&local_160,1);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(path->_M_dataplus)._M_p,path->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," Buffer Size: ",0xe);
    cVar6 = '\x01';
    if (9 < buffer_size) {
      iVar13 = buffer_size;
      cVar14 = '\x04';
      do {
        cVar6 = cVar14;
        if (iVar13 < 100) {
          cVar6 = cVar6 + -2;
          goto LAB_003f8d66;
        }
        if (iVar13 < 1000) {
          cVar6 = cVar6 + -1;
          goto LAB_003f8d66;
        }
        if (iVar13 < 10000) goto LAB_003f8d66;
        bVar3 = 99999 < iVar13;
        iVar13 = iVar13 / 10000;
        cVar14 = cVar6 + '\x04';
      } while (bVar3);
      cVar6 = cVar6 + '\x01';
    }
LAB_003f8d66:
    local_160 = &local_150;
    std::__cxx11::string::_M_construct((ulong)&local_160,cVar6);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_160,(uint)local_158,buffer_size);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)local_160,local_158);
    local_138 = (char *)CONCAT71(local_138._1_7_,10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)&local_138,1);
    if (local_160 != &local_150) {
      operator_delete(local_160);
    }
    duckdb::
    unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
    ::operator->((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                  *)&local_140);
    puVar8 = (undefined8 *)duckdb::BaseQueryResult::GetError_abi_cxx11_();
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)*puVar8,puVar8[1]);
    local_160 = (ulong *)CONCAT71(local_160._1_7_,10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)&local_160,1);
  }
  cVar6 = '\0';
LAB_003f8ea7:
  if (local_140._M_head_impl != (MaterializedQueryResult *)0x0) {
    (**(code **)(*(long *)local_140._M_head_impl + 8))();
  }
  duckdb::Connection::~Connection(local_80);
  duckdb::DuckDB::~DuckDB(local_60);
  return (bool)cVar6;
}

Assistant:

bool RunVariableBuffer(const string &path, idx_t buffer_size, bool set_temp_dir,
                       ColumnDataCollection *ground_truth = nullptr, const string &add_parameters = "") {
	DuckDB db(nullptr);
	Connection multi_conn(db);
	if (set_temp_dir) {
		multi_conn.Query("PRAGMA temp_directory='offload.tmp'");
	}
	multi_conn.Query("SET preserve_insertion_order=false;");
	duckdb::unique_ptr<MaterializedQueryResult> variable_buffer_size_result =
	    multi_conn.Query("SELECT * FROM read_csv_auto('" + path + "'" + add_parameters +
	                     ", buffer_size = " + to_string(buffer_size) + ") ORDER BY ALL");
	bool variable_buffer_size_passed;
	ColumnDataCollection *result = nullptr;
	if (variable_buffer_size_result->HasError()) {
		variable_buffer_size_passed = false;
	} else {
		variable_buffer_size_passed = true;
		result = &variable_buffer_size_result->Collection();
	}
	if (!ground_truth && !variable_buffer_size_passed) {
		// Two wrongs can make a right
		return true;
	}
	if (!ground_truth) {
		//! oh oh, this should not pass
		std::cout << path << " Failed on max buffer but succeeded on variable buffer reading" << '\n';
		return false;
	}
	if (!variable_buffer_size_passed) {
		std::cout << path << " Variable Buffer failed" << '\n';
		std::cout << path << " Buffer Size: " << to_string(buffer_size) << '\n';
		std::cout << variable_buffer_size_result->GetError() << '\n';
		return false;
	}
	// Results do not match
	string error_message;
	if (!ColumnDataCollection::ResultEquals(*ground_truth, *result, error_message, false)) {
		std::cout << "truth: " << ground_truth->Count() << std::endl;
		std::cout << "resul: " << result->Count() << std::endl;

		std::cout << path << " Buffer Size: " << to_string(buffer_size) << '\n';
		std::cout << error_message << '\n';
		return false;
	}
	return true;
}